

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O1

void av1_dist_wtd_comp_weight_assign
               (AV1_COMMON *cm,MB_MODE_INFO *mbmi,int *fwd_offset,int *bck_offset,
               int *use_dist_wtd_comp_avg,int is_compound)

{
  SequenceHeader *pSVar1;
  RefCntBuffer *pRVar2;
  int *piVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  RefCntBuffer *pRVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  
  if ((is_compound == 0) || ((mbmi->field_0xa8 & 2) != 0)) {
    *fwd_offset = 8;
    *bck_offset = 8;
    *use_dist_wtd_comp_avg = 0;
    return;
  }
  *use_dist_wtd_comp_avg = 1;
  iVar4 = -1;
  if ((byte)(mbmi->ref_frame[0] - 1U) < 8) {
    iVar4 = cm->remapped_ref_idx[(byte)mbmi->ref_frame[0] - 1];
  }
  if (iVar4 == -1) {
    pRVar9 = (RefCntBuffer *)0x0;
  }
  else {
    pRVar9 = cm->ref_frame_map[iVar4];
  }
  iVar4 = -1;
  if ((byte)(mbmi->ref_frame[1] - 1U) < 8) {
    iVar4 = cm->remapped_ref_idx[(byte)mbmi->ref_frame[1] - 1];
  }
  uVar8 = 0;
  if (iVar4 == -1) {
    pRVar2 = (RefCntBuffer *)0x0;
  }
  else {
    pRVar2 = cm->ref_frame_map[iVar4];
  }
  if (pRVar9 != (RefCntBuffer *)0x0) {
    uVar8 = pRVar9->order_hint;
  }
  uVar6 = 0;
  uVar5 = 0;
  if (pRVar2 != (RefCntBuffer *)0x0) {
    uVar5 = pRVar2->order_hint;
  }
  uVar11 = cm->cur_frame->order_hint;
  pSVar1 = cm->seq_params;
  iVar4 = (pSVar1->order_hint_info).enable_order_hint;
  if (iVar4 != 0) {
    uVar5 = uVar5 - uVar11;
    uVar6 = 1 << ((byte)(pSVar1->order_hint_info).order_hint_bits_minus_1 & 0x1f);
    uVar6 = (uVar6 - 1 & uVar5) - (uVar6 & uVar5);
  }
  uVar5 = -uVar6;
  if (0 < (int)uVar6) {
    uVar5 = uVar6;
  }
  if (0x1e < (int)uVar5) {
    uVar5 = 0x1f;
  }
  if (iVar4 == 0) {
    uVar8 = 0;
  }
  else {
    uVar11 = uVar11 - uVar8;
    uVar8 = 1 << ((byte)(pSVar1->order_hint_info).order_hint_bits_minus_1 & 0x1f);
    uVar8 = (uVar8 - 1 & uVar11) - (uVar8 & uVar11);
  }
  uVar11 = -uVar8;
  if (0 < (int)uVar8) {
    uVar11 = uVar8;
  }
  uVar7 = 0x1f;
  if ((int)uVar11 < 0x1f) {
    uVar7 = uVar11;
  }
  if ((uVar6 == 0) || (uVar8 == 0)) {
    *fwd_offset = quant_dist_lookup_table[3][uVar5 <= uVar11];
    piVar3 = quant_dist_lookup_table[3] + (uVar11 < uVar5);
  }
  else {
    uVar10 = 0;
    do {
      iVar4 = quant_dist_weight[uVar10][uVar5 <= uVar11] * uVar5;
      iVar12 = quant_dist_weight[uVar10][uVar11 < uVar5] * uVar7;
      if ((uVar11 < uVar5 && iVar4 < iVar12) || (uVar11 >= uVar5 && iVar12 < iVar4))
      goto LAB_0039fd75;
      uVar10 = uVar10 + 1;
    } while (uVar10 != 3);
    uVar10 = 3;
LAB_0039fd75:
    *fwd_offset = quant_dist_lookup_table[uVar10 & 0xffffffff][uVar11 >= uVar5];
    piVar3 = quant_dist_lookup_table[uVar10 & 0xffffffff] + (uVar11 < uVar5);
  }
  *bck_offset = *piVar3;
  return;
}

Assistant:

void av1_dist_wtd_comp_weight_assign(const AV1_COMMON *cm,
                                     const MB_MODE_INFO *mbmi, int *fwd_offset,
                                     int *bck_offset,
                                     int *use_dist_wtd_comp_avg,
                                     int is_compound) {
  assert(fwd_offset != NULL && bck_offset != NULL);
  if (!is_compound || mbmi->compound_idx) {
    *fwd_offset = 8;
    *bck_offset = 8;
    *use_dist_wtd_comp_avg = 0;
    return;
  }

  *use_dist_wtd_comp_avg = 1;
  const RefCntBuffer *const bck_buf = get_ref_frame_buf(cm, mbmi->ref_frame[0]);
  const RefCntBuffer *const fwd_buf = get_ref_frame_buf(cm, mbmi->ref_frame[1]);
  const int cur_frame_index = cm->cur_frame->order_hint;
  int bck_frame_index = 0, fwd_frame_index = 0;

  if (bck_buf != NULL) bck_frame_index = bck_buf->order_hint;
  if (fwd_buf != NULL) fwd_frame_index = fwd_buf->order_hint;

  int d0 = clamp(abs(get_relative_dist(&cm->seq_params->order_hint_info,
                                       fwd_frame_index, cur_frame_index)),
                 0, MAX_FRAME_DISTANCE);
  int d1 = clamp(abs(get_relative_dist(&cm->seq_params->order_hint_info,
                                       cur_frame_index, bck_frame_index)),
                 0, MAX_FRAME_DISTANCE);

  const int order = d0 <= d1;

  if (d0 == 0 || d1 == 0) {
    *fwd_offset = quant_dist_lookup_table[3][order];
    *bck_offset = quant_dist_lookup_table[3][1 - order];
    return;
  }

  int i;
  for (i = 0; i < 3; ++i) {
    int c0 = quant_dist_weight[i][order];
    int c1 = quant_dist_weight[i][!order];
    int d0_c0 = d0 * c0;
    int d1_c1 = d1 * c1;
    if ((d0 > d1 && d0_c0 < d1_c1) || (d0 <= d1 && d0_c0 > d1_c1)) break;
  }

  *fwd_offset = quant_dist_lookup_table[i][order];
  *bck_offset = quant_dist_lookup_table[i][1 - order];
}